

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r)

{
  int iVar1;
  undefined8 in_RAX;
  array_container_t *src;
  long lVar2;
  uint uVar3;
  undefined8 uStack_28;
  
  uVar3 = 0;
  lVar2 = 0;
  uStack_28 = in_RAX;
  do {
    if ((r->high_low_container).size <= (int)uVar3) {
      iVar1 = ra_shrink_to_fit(&r->high_low_container);
      return lVar2 + iVar1;
    }
    uStack_28 = CONCAT17((r->high_low_container).typecodes[uVar3 & 0xffff],(undefined7)uStack_28);
    src = (array_container_t *)
          container_mutable_unwrap_shared
                    ((r->high_low_container).containers[uVar3 & 0xffff],
                     (uint8_t *)((long)&uStack_28 + 7));
    if (uStack_28._7_1_ == '\x01') {
      iVar1 = 0;
    }
    else if (uStack_28._7_1_ == '\x03') {
      iVar1 = run_container_shrink_to_fit((run_container_t *)src);
    }
    else {
      if (uStack_28._7_1_ != '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1121,"int container_shrink_to_fit(container_t *, uint8_t)");
      }
      iVar1 = array_container_shrink_to_fit(src);
    }
    lVar2 = lVar2 + iVar1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r) {
    size_t answer = 0;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original;
        container_t *c = ra_get_container_at_index(&r->high_low_container, i,
                                                   &type_original);
        answer += container_shrink_to_fit(c, type_original);
    }
    answer += ra_shrink_to_fit(&r->high_low_container);
    return answer;
}